

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::CXMLReaderImpl
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,IFileReadCallBack *callback,
          bool deleteCallBack)

{
  bool deleteCallBack_local;
  IFileReadCallBack *callback_local;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>::IIrrXMLReader
            (&this->super_IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>);
  (this->super_IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>)._vptr_IIrrXMLReader =
       (_func_int **)&PTR__CXMLReaderImpl_01019b78;
  this->TextData = (unsigned_long *)0x0;
  this->P = (unsigned_long *)0x0;
  this->TextBegin = (unsigned_long *)0x0;
  this->TextSize = 0;
  this->CurrentNodeType = EXN_NONE;
  this->SourceFormat = ETF_ASCII;
  this->TargetFormat = ETF_ASCII;
  core::string<unsigned_long>::string(&this->NodeName);
  core::string<unsigned_long>::string(&this->EmptyString);
  core::array<irr::core::string<unsigned_long>_>::array(&this->SpecialCharacters);
  core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::array
            (&this->Attributes);
  if (callback != (IFileReadCallBack *)0x0) {
    storeTargetFormat(this);
    readFile(this,callback);
    if ((deleteCallBack) && (callback != (IFileReadCallBack *)0x0)) {
      (*callback->_vptr_IFileReadCallBack[1])();
    }
    createSpecialCharacterList(this);
    this->P = this->TextBegin;
  }
  return;
}

Assistant:

CXMLReaderImpl(IFileReadCallBack* callback, bool deleteCallBack = true)
		: TextData(0), P(0), TextBegin(0), TextSize(0), CurrentNodeType(EXN_NONE),
		SourceFormat(ETF_ASCII), TargetFormat(ETF_ASCII)
	{
		if (!callback)
			return;

		storeTargetFormat();

		// read whole xml file

		readFile(callback);
		
		// clean up

		if (deleteCallBack)
			delete callback;

		// create list with special characters

		createSpecialCharacterList();

		// set pointer to text begin
		P = TextBegin;
	}